

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O2

optional<dap::StoppedEvent> * __thiscall
cmDebugger::cmDebuggerExceptionManager::RaiseExceptionIfAny
          (optional<dap::StoppedEvent> *__return_storage_ptr__,cmDebuggerExceptionManager *this,
          MessageType t,string *text)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  unique_lock<std::mutex> lock;
  MessageType local_124;
  unique_lock<std::mutex> local_120;
  undefined1 local_110 [64];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  bool local_a8;
  pointer local_a0;
  undefined1 uStack_98;
  undefined7 uStack_97;
  undefined1 uStack_90;
  undefined8 uStack_8f;
  optional<dap::boolean> local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  integer local_30;
  bool local_28;
  
  (__return_storage_ptr__->super__Optional_base<dap::StoppedEvent,_false,_false>)._M_payload.
  super__Optional_payload<dap::StoppedEvent,_true,_false,_false>.
  super__Optional_payload_base<dap::StoppedEvent>._M_engaged = false;
  local_124 = t;
  std::unique_lock<std::mutex>::unique_lock(&local_120,&this->Mutex);
  pmVar1 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->ExceptionMap,&local_124);
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->RaiseExceptions,&pmVar1->Filter);
  if (*pmVar2 == true) {
    local_c8._M_p = (pointer)&local_b8;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    local_a8 = false;
    local_a0 = (pointer)0x0;
    uStack_98 = 0;
    uStack_97 = 0;
    uStack_90 = 0;
    uStack_8f = 0;
    local_80.val.val = false;
    local_80.set = false;
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_38 = false;
    local_30.val = 0;
    local_28 = false;
    local_d0[0] = true;
    local_d0[1] = true;
    std::__cxx11::string::assign((char *)&local_78);
    dap::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_c8,(char (*) [19])"Pause on exception");
    dap::optional<std::__cxx11::string>::operator=((optional<std::__cxx11::string> *)&local_58,text)
    ;
    pmVar1 = std::__detail::
             _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->ExceptionMap,&local_124);
    std::__cxx11::string::string((string *)local_110,(string *)pmVar1);
    std::__cxx11::string::string((string *)(local_110 + 0x20),(string *)text);
    std::optional<cmDebugger::cmDebuggerException>::operator=
              (&this->TheException,(cmDebuggerException *)local_110);
    cmDebuggerException::~cmDebuggerException((cmDebuggerException *)local_110);
    std::optional<dap::StoppedEvent>::operator=(__return_storage_ptr__,(StoppedEvent *)local_d0);
    dap::StoppedEvent::~StoppedEvent((StoppedEvent *)local_d0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_120);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<dap::StoppedEvent>
cmDebuggerExceptionManager::RaiseExceptionIfAny(MessageType t,
                                                std::string const& text)
{
  cm::optional<dap::StoppedEvent> maybeStoppedEvent;
  std::unique_lock<std::mutex> lock(Mutex);
  if (RaiseExceptions[ExceptionMap[t].Filter]) {
    dap::StoppedEvent stoppedEvent;
    stoppedEvent.allThreadsStopped = true;
    stoppedEvent.reason = "exception";
    stoppedEvent.description = "Pause on exception";
    stoppedEvent.text = text;
    TheException = cmDebuggerException{ ExceptionMap[t].Filter, text };
    maybeStoppedEvent = std::move(stoppedEvent);
  }

  return maybeStoppedEvent;
}